

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_check_duplicate_extensions(CBS *cbs)

{
  unsigned_short *puVar1;
  bool bVar2;
  int iVar3;
  size_t new_size;
  long lVar4;
  size_t i;
  ulong uVar5;
  Array<unsigned_short> extension_types;
  CBS extensions;
  uint16_t type;
  
  extensions.data = cbs->data;
  extensions.len = cbs->len;
  new_size = 0;
  while (extensions.len != 0) {
    iVar3 = CBS_get_u16(&extensions,&type);
    if (iVar3 == 0) {
      return false;
    }
    iVar3 = CBS_get_u16_length_prefixed(&extensions,(CBS *)&extension_types);
    new_size = new_size + 1;
    if (iVar3 == 0) {
      return false;
    }
  }
  if (new_size == 0) {
    return true;
  }
  extension_types.data_ = (unsigned_short *)0x0;
  extension_types.size_ = 0;
  bVar2 = Array<unsigned_short>::InitUninitialized(&extension_types,new_size);
  if (bVar2) {
    extensions.data = cbs->data;
    extensions.len = cbs->len;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < extension_types.size_; uVar5 = uVar5 + 1) {
      iVar3 = CBS_get_u16(&extensions,(uint16_t *)((long)extension_types.data_ + lVar4));
      if ((iVar3 == 0) ||
         (iVar3 = CBS_get_u16_length_prefixed(&extensions,(CBS *)&type), iVar3 == 0))
      goto LAB_00131d47;
      lVar4 = lVar4 + 2;
    }
    if (extensions.len != 0) {
      __assert_fail("CBS_len(&extensions) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x58,"bool bssl::tls1_check_duplicate_extensions(const CBS *)");
    }
    std::__sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
              (extension_types.data_,extension_types.data_ + extension_types.size_);
    uVar5 = 1;
    do {
      bVar2 = new_size == uVar5;
      if (bVar2) break;
      if ((uVar5 - extension_types.size_ == 1) || (extension_types.size_ <= uVar5)) {
        abort();
      }
      lVar4 = uVar5 - 1;
      puVar1 = extension_types.data_ + uVar5;
      uVar5 = uVar5 + 1;
    } while (extension_types.data_[lVar4] != *puVar1);
  }
  else {
LAB_00131d47:
    bVar2 = false;
  }
  Array<unsigned_short>::~Array(&extension_types);
  return bVar2;
}

Assistant:

static bool tls1_check_duplicate_extensions(const CBS *cbs) {
  // First pass: count the extensions.
  size_t num_extensions = 0;
  CBS extensions = *cbs;
  while (CBS_len(&extensions) > 0) {
    uint16_t type;
    CBS extension;

    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    num_extensions++;
  }

  if (num_extensions == 0) {
    return true;
  }

  Array<uint16_t> extension_types;
  if (!extension_types.InitForOverwrite(num_extensions)) {
    return false;
  }

  // Second pass: gather the extension types.
  extensions = *cbs;
  for (size_t i = 0; i < extension_types.size(); i++) {
    CBS extension;

    if (!CBS_get_u16(&extensions, &extension_types[i]) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      // This should not happen.
      return false;
    }
  }
  assert(CBS_len(&extensions) == 0);

  // Sort the extensions and make sure there are no duplicates.
  std::sort(extension_types.begin(), extension_types.end());
  for (size_t i = 1; i < num_extensions; i++) {
    if (extension_types[i - 1] == extension_types[i]) {
      return false;
    }
  }

  return true;
}